

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool ot::commissioner::utils::CaseInsensitiveEqual(string *aLhs,string *aRhs)

{
  int iVar1;
  bool bVar2;
  string local_50;
  string local_30;
  
  ToLower(&local_30,aLhs);
  ToLower(&local_50,aRhs);
  if (local_30._M_string_length == local_50._M_string_length) {
    if (local_30._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_30._M_dataplus._M_p,local_50._M_dataplus._M_p,local_30._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool CaseInsensitiveEqual(const std::string &aLhs, const std::string &aRhs)
{
    return ToLower(aLhs) == ToLower(aRhs);
}